

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

char * Curl_copy_header_value(char *header)

{
  char cVar1;
  ushort **ppuVar2;
  byte *pbVar3;
  char *__dest;
  size_t sVar4;
  byte *__s;
  byte bVar5;
  ulong uVar6;
  byte *pbVar7;
  
  for (; (cVar1 = *header, cVar1 != '\0' && (cVar1 != ':')); header = header + 1) {
  }
  uVar6 = (ulong)(cVar1 != '\0');
  bVar5 = header[uVar6];
  if (bVar5 != 0) {
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)bVar5 * 2 + 1) & 0x20) == 0) break;
      bVar5 = header[uVar6 + 1];
      uVar6 = uVar6 + 1;
    } while (bVar5 != 0);
  }
  __s = (byte *)(header + uVar6);
  pbVar3 = (byte *)strchr((char *)__s,0xd);
  if ((pbVar3 == (byte *)0x0) && (pbVar3 = (byte *)strchr((char *)__s,10), pbVar3 == (byte *)0x0)) {
    sVar4 = strlen((char *)__s);
    pbVar3 = __s + sVar4;
  }
  pbVar7 = pbVar3;
  if (__s < pbVar3) {
    ppuVar2 = __ctype_b_loc();
    do {
      pbVar7 = pbVar3;
      if ((*(byte *)((long)*ppuVar2 + (ulong)*pbVar3 * 2 + 1) & 0x20) == 0) break;
      pbVar3 = pbVar3 + -1;
      pbVar7 = __s;
    } while (__s < pbVar3);
  }
  __dest = (char *)(*Curl_cmalloc)((size_t)(pbVar7 + (2 - (long)__s)));
  if (__dest == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    memcpy(__dest,__s,(size_t)(pbVar7 + (1 - (long)__s)));
    __dest[(long)(pbVar7 + (1 - (long)__s))] = '\0';
  }
  return __dest;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  DEBUGASSERT(header);

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* zero terminate */

  return value;
}